

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_callback_ret.cpp
# Opt level: O2

void __thiscall cubeb_test_output_callback_Test::TestBody(cubeb_test_output_callback_Test *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"output only, return 0",&local_31);
  run_test_callback(OUTPUT_ONLY,data_cb_ret_zero,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_30,"output only, return nframes - 1",&local_31);
  run_test_callback(OUTPUT_ONLY,data_cb_ret_nframes_minus_one,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_30,"output only, return nframes",&local_31);
  run_test_callback(OUTPUT_ONLY,data_cb_ret_nframes,&local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

TEST(cubeb, test_output_callback)
{
  run_test_callback(OUTPUT_ONLY, data_cb_ret_zero, "output only, return 0");
  run_test_callback(OUTPUT_ONLY, data_cb_ret_nframes_minus_one, "output only, return nframes - 1");
  run_test_callback(OUTPUT_ONLY, data_cb_ret_nframes, "output only, return nframes");
}